

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O2

ostream * operator<<(ostream *os,Bytes *in)

{
  size_t sVar1;
  ostream *poVar2;
  Span<const_unsigned_char> in_00;
  string local_30;
  
  sVar1 = (in->span_).size_;
  if (sVar1 != 0) {
    in_00.size_ = sVar1;
    in_00.data_ = (in->span_).data_;
    EncodeHex_abi_cxx11_(&local_30,in_00);
    std::operator<<(os,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return os;
  }
  poVar2 = std::operator<<(os,"<empty Bytes>");
  return poVar2;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Bytes &in) {
  if (in.span_.empty()) {
    return os << "<empty Bytes>";
  }

  // Print a byte slice as hex.
  os << EncodeHex(in.span_);
  return os;
}